

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCMP0018Flags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  string *this_00;
  bool bVar1;
  TargetType TVar2;
  bool local_92;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  bool local_35;
  TargetType local_34;
  bool shared;
  string *psStack_30;
  int targetType;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  psStack_30 = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  local_34 = cmGeneratorTarget::GetType(target);
  local_92 = local_34 == SHARED_LIBRARY || local_34 == MODULE_LIBRARY;
  local_35 = local_92;
  bVar1 = GetShouldUseOldFlags(this,local_92,config_local);
  if (bVar1) {
    AddSharedFlags(this,(string *)target_local,config_local,(bool)(local_35 & 1));
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
    this_00 = lang_local;
    if (TVar2 == OBJECT_LIBRARY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"POSITION_INDEPENDENT_CODE",&local_59);
      bVar1 = cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)this_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      if (bVar1) {
        AddPositionIndependentFlags(this,(string *)target_local,config_local,local_34);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"POSITION_INDEPENDENT_CODE",&local_91);
      bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                        ((cmGeneratorTarget *)this_00,&local_90,psStack_30);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      if (bVar1) {
        AddPositionIndependentFlags(this,(string *)target_local,config_local,local_34);
      }
      if ((local_35 & 1U) != 0) {
        AppendFeatureOptions(this,(string *)target_local,config_local,"DLL");
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCMP0018Flags(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       std::string const& lang,
                                       const std::string& config)
{
  int targetType = target->GetType();

  bool shared = ((targetType == cmStateEnums::SHARED_LIBRARY) ||
                 (targetType == cmStateEnums::MODULE_LIBRARY));

  if (this->GetShouldUseOldFlags(shared, lang)) {
    this->AddSharedFlags(flags, lang, shared);
  } else {
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      if (target->GetPropertyAsBool("POSITION_INDEPENDENT_CODE")) {
        this->AddPositionIndependentFlags(flags, lang, targetType);
      }
      return;
    }

    if (target->GetLinkInterfaceDependentBoolProperty(
          "POSITION_INDEPENDENT_CODE", config)) {
      this->AddPositionIndependentFlags(flags, lang, targetType);
    }
    if (shared) {
      this->AppendFeatureOptions(flags, lang, "DLL");
    }
  }
}